

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O1

int luv_fs_open(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  lua_Integer lVar4;
  uv_fs_t *req;
  luv_req_t *plVar5;
  uv_loop_t *loop;
  char *pcVar6;
  char *pcVar7;
  code *cb;
  
  pcVar3 = luaL_checklstring(L,1,(size_t *)0x0);
  iVar1 = lua_isnumber(L,2);
  if (iVar1 == 0) {
    iVar1 = lua_isstring(L,2);
    if (iVar1 == 0) {
      iVar1 = luaL_argerror(L,2,"Expected string or integer for file open mode");
    }
    else {
      iVar1 = 0;
      pcVar6 = lua_tolstring(L,2,(size_t *)0x0);
      iVar2 = strcmp(pcVar6,"r");
      if (iVar2 != 0) {
        iVar2 = strcmp(pcVar6,"rs");
        iVar1 = 0x101000;
        if ((iVar2 != 0) && (iVar2 = strcmp(pcVar6,"sr"), iVar2 != 0)) {
          iVar1 = strcmp(pcVar6,"r+");
          if (iVar1 == 0) {
            iVar1 = 2;
          }
          else {
            iVar2 = strcmp(pcVar6,"rs+");
            iVar1 = 0x101002;
            if ((iVar2 != 0) && (iVar2 = strcmp(pcVar6,"sr+"), iVar2 != 0)) {
              iVar1 = strcmp(pcVar6,"w");
              if (iVar1 == 0) {
                iVar1 = 0x241;
              }
              else {
                iVar2 = strcmp(pcVar6,"wx");
                iVar1 = 0x2c1;
                if ((iVar2 != 0) && (iVar2 = strcmp(pcVar6,"xw"), iVar2 != 0)) {
                  iVar1 = strcmp(pcVar6,"w+");
                  if (iVar1 == 0) {
                    iVar1 = 0x242;
                  }
                  else {
                    iVar2 = strcmp(pcVar6,"wx+");
                    iVar1 = 0x2c2;
                    if ((iVar2 != 0) && (iVar2 = strcmp(pcVar6,"xw+"), iVar2 != 0)) {
                      iVar1 = strcmp(pcVar6,"a");
                      if (iVar1 == 0) {
                        iVar1 = 0x441;
                      }
                      else {
                        iVar2 = strcmp(pcVar6,"ax");
                        iVar1 = 0x4c1;
                        if ((iVar2 != 0) && (iVar2 = strcmp(pcVar6,"xa"), iVar2 != 0)) {
                          iVar1 = strcmp(pcVar6,"a+");
                          if (iVar1 == 0) {
                            iVar1 = 0x442;
                          }
                          else {
                            iVar2 = strcmp(pcVar6,"ax+");
                            iVar1 = 0x4c2;
                            if ((iVar2 != 0) && (iVar2 = strcmp(pcVar6,"xa+"), iVar2 != 0)) {
                              iVar1 = luaL_error(L,"Unknown file open flag \'%s\'",pcVar6);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    lVar4 = lua_tointegerx(L,2,(int *)0x0);
    iVar1 = (int)lVar4;
  }
  lVar4 = luaL_checkinteger(L,3);
  iVar2 = luv_check_continuation(L,4);
  req = (uv_fs_t *)lua_newuserdata(L,0x1b8);
  plVar5 = luv_setup_req(L,iVar2);
  req->data = plVar5;
  iVar2 = plVar5->callback_ref;
  loop = luv_loop(L);
  cb = (uv_fs_cb)0x0;
  if (iVar2 != -2) {
    cb = luv_fs_cb;
  }
  iVar1 = uv_fs_open(loop,req,pcVar3,iVar1,(int)lVar4,cb);
  if ((req->fs_type == UV_FS_ACCESS) || (-1 < iVar1)) {
    if (iVar2 == -2) {
      iVar1 = push_fs_result(L,req);
      if (req->fs_type != UV_FS_SCANDIR) {
        luv_cleanup_req(L,(luv_req_t *)req->data);
        req->data = (void *)0x0;
        uv_fs_req_cleanup(req);
      }
    }
    else {
      lua_rawgeti(L,-0xf4628,(long)plVar5->req_ref);
      iVar1 = 1;
    }
  }
  else {
    lua_pushnil(L);
    pcVar3 = req->path;
    pcVar6 = uv_err_name((int)req->result);
    pcVar7 = uv_strerror((int)req->result);
    if (pcVar3 == (char *)0x0) {
      lua_pushfstring(L,"%s: %s",pcVar6,pcVar7);
    }
    else {
      lua_pushfstring(L,"%s: %s: %s",pcVar6,pcVar7,req->path);
    }
    pcVar3 = uv_err_name((int)req->result);
    lua_pushstring(L,pcVar3);
    luv_cleanup_req(L,(luv_req_t *)req->data);
    req->data = (void *)0x0;
    uv_fs_req_cleanup(req);
    iVar1 = 3;
  }
  return iVar1;
}

Assistant:

static int luv_fs_open(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  const char* path = luaL_checkstring(L, 1);
  int flags = luv_check_flags(L, 2);
  int mode = luaL_checkinteger(L, 3);
  int ref = luv_check_continuation(L, 4);
  uv_fs_t* req = (uv_fs_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);
  FS_CALL(open, req, path, flags, mode);
}